

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O1

Am_Object Am_Get_Animator(Am_Object *obj,Am_Slot_Key key)

{
  bool bVar1;
  int iVar2;
  Am_Constraint *pAVar3;
  Am_Slot_Key in_DX;
  undefined6 in_register_00000032;
  Am_Object *prev;
  Am_Constraint_Iterator iter;
  Am_Slot slot;
  Am_Constraint_Iterator local_40;
  Am_Slot local_30;
  
  local_30 = Am_Object_Advanced::Get_Slot
                       ((Am_Object_Advanced *)CONCAT62(in_register_00000032,key),in_DX);
  Am_Constraint_Iterator::Am_Constraint_Iterator(&local_40,&local_30);
  Am_Constraint_Iterator::Start(&local_40);
  bVar1 = Am_Constraint_Iterator::Last(&local_40);
  prev = &Am_No_Object;
  if (!bVar1) {
    do {
      pAVar3 = Am_Constraint_Iterator::Get(&local_40);
      iVar2 = (**(pAVar3->super_Am_Registered_Type)._vptr_Am_Registered_Type)(pAVar3);
      if ((Am_ID_Tag)iVar2 == Animation_Constraint::id) {
        prev = (Am_Object *)(pAVar3 + 5);
        break;
      }
      Am_Constraint_Iterator::Next(&local_40);
      bVar1 = Am_Constraint_Iterator::Last(&local_40);
    } while (!bVar1);
  }
  Am_Object::Am_Object(obj,prev);
  return (Am_Object)(Am_Object_Data *)obj;
}

Assistant:

Am_Object
Am_Get_Animator(Am_Object obj, Am_Slot_Key key)
{
  Am_Slot slot = ((Am_Object_Advanced &)obj).Get_Slot(key);
  Am_Constraint_Iterator iter = slot;
  Am_Constraint *curr;
  for (iter.Start(); !iter.Last(); iter.Next()) {
    curr = iter.Get();
    if (curr->ID() == Animation_Constraint::id) {
      Animation_Constraint *anim_constraint = (Animation_Constraint *)curr;
      return anim_constraint->interpolator;
    }
  }

  return Am_No_Object;
}